

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

size_t __thiscall booster::aio::stream_socket::bytes_readable(stream_socket *this,error_code *e)

{
  native_type __fd;
  int iVar1;
  undefined8 *in_RSI;
  basic_io_device *in_RDI;
  error_code eVar2;
  int r;
  int size;
  undefined4 uStack_2c;
  int local_1c;
  undefined8 *local_18;
  size_t local_8;
  
  local_1c = 0;
  local_18 = in_RSI;
  __fd = basic_io_device::native(in_RDI);
  iVar1 = ioctl(__fd,0x541b,&local_1c);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    *local_18 = CONCAT44(uStack_2c,eVar2._M_value);
    local_18[1] = eVar2._M_cat;
    local_8 = 0;
  }
  else {
    local_8 = (size_t)local_1c;
  }
  return local_8;
}

Assistant:

size_t stream_socket::bytes_readable(booster::system::error_code &e)
{
	#ifdef BOOSTER_WIN32
	unsigned long size = 0;
	int r = ::ioctlsocket(native(),FIONREAD,&size);
	if(r != 0) {
		e=geterror();
		return 0;
	}
	return size;
	#else
	int size = 0;
	int r = ::ioctl(native(),FIONREAD,&size);
	if(r < 0) {
		e=geterror();
		return 0;
	}
	return size;
	#endif
}